

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O2

void NULLCCanvas::CanvasDrawLineAA(double x1,double y1,double x2,double y2,Canvas *ptr)

{
  double __x;
  uint x;
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 local_a8 [16];
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
    return;
  }
  dVar7 = x2 - x1;
  dVar9 = y2 - y1;
  auVar11._0_8_ = -dVar7;
  auVar11._8_8_ = -dVar9;
  auVar12._8_8_ = dVar9;
  auVar12._0_8_ = dVar7;
  auVar12 = maxpd(auVar11,auVar12);
  dVar13 = auVar12._8_8_;
  dVar10 = auVar12._0_8_;
  dVar6 = x2;
  dVar8 = dVar9;
  dVar4 = x1;
  if (dVar10 < dVar13) {
    dVar6 = y2;
    dVar8 = dVar7;
    dVar7 = dVar9;
    dVar4 = y1;
    y1 = x1;
    y2 = x2;
  }
  dVar9 = y1;
  dVar5 = dVar4;
  if (dVar6 < dVar4) {
    dVar9 = y2;
    dVar5 = dVar6;
    dVar6 = dVar4;
    y2 = y1;
  }
  if (dVar5 < 0.0) {
    if (dVar6 < 0.0) {
      return;
    }
    dVar4 = -dVar5 / (dVar6 - dVar5);
    dVar9 = dVar9 * (1.0 - dVar4) + dVar4 * y2;
    dVar5 = 0.0;
  }
  dVar4 = (double)(int)ptr->color[(ulong)(dVar10 < dVar13) - 2];
  if (dVar5 <= dVar4) {
    __x = dVar5 + 0.5;
    dVar8 = dVar8 / dVar7;
    dVar9 = ((double)(int)__x - dVar5) * dVar8 + dVar9;
    dVar7 = floor(__x);
    uVar2 = (uint)dVar9;
    dVar5 = floor(dVar9);
    if (dVar6 <= dVar4) {
      dVar4 = dVar6;
    }
    x = (uint)__x;
    dVar7 = (dVar7 - __x) + 1.0;
    dVar6 = ((dVar5 - dVar9) + 1.0) * dVar7;
    if (dVar13 <= dVar10) {
      CanvasDrawPointInternal(x,uVar2,dVar6,ptr);
      uVar1 = uVar2 + 1;
      uVar2 = x;
    }
    else {
      CanvasDrawPointInternal(uVar2,x,dVar6,ptr);
      uVar1 = x;
      uVar2 = uVar2 + 1;
    }
    CanvasDrawPointInternal(uVar2,uVar1,(dVar9 - dVar5) * dVar7,ptr);
    dVar5 = dVar4 + 0.5;
    dVar6 = ((double)(int)dVar5 - dVar4) * dVar8 + y2;
    dVar7 = floor(dVar5);
    uVar2 = (uint)dVar6;
    dVar4 = floor(dVar6);
    local_a8._8_8_ = 0;
    local_a8._0_8_ = dVar9 + dVar8;
    uVar1 = (uint)dVar5;
    dVar9 = ((dVar4 - dVar6) + 1.0) * (dVar5 - dVar7);
    dVar6 = (dVar6 - dVar4) * (dVar5 - dVar7);
    if (dVar13 <= dVar10) {
      CanvasDrawPointInternal(uVar1,uVar2,dVar9,ptr);
      CanvasDrawPointInternal(uVar1,uVar2 + 1,dVar6,ptr);
      while (x = x + 1, (int)x < (int)uVar1) {
        dVar6 = floor((double)local_a8._0_8_);
        CanvasDrawPointInternal
                  (x,(int)(double)local_a8._0_8_,(dVar6 - (double)local_a8._0_8_) + 1.0,ptr);
        CanvasDrawPointInternal
                  (x,(int)(double)local_a8._0_8_ + 1,(double)local_a8._0_8_ - dVar6,ptr);
        uVar3 = local_a8._12_4_;
        local_a8._8_4_ = local_a8._8_4_;
        local_a8._0_8_ = (double)local_a8._0_8_ + dVar8;
        local_a8._12_4_ = uVar3;
      }
    }
    else {
      CanvasDrawPointInternal(uVar2,uVar1,dVar9,ptr);
      CanvasDrawPointInternal(uVar2 + 1,uVar1,dVar6,ptr);
      while (x = x + 1, (int)x < (int)uVar1) {
        dVar6 = floor((double)local_a8._0_8_);
        CanvasDrawPointInternal
                  ((int)(double)local_a8._0_8_,x,(dVar6 - (double)local_a8._0_8_) + 1.0,ptr);
        CanvasDrawPointInternal
                  ((int)(double)local_a8._0_8_ + 1,x,(double)local_a8._0_8_ - dVar6,ptr);
        uVar3 = local_a8._12_4_;
        local_a8._8_4_ = local_a8._8_4_;
        local_a8._0_8_ = (double)local_a8._0_8_ + dVar8;
        local_a8._12_4_ = uVar3;
      }
    }
  }
  return;
}

Assistant:

void CanvasDrawLineAA(double x1, double y1, double x2, double y2, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		double dx = x2 - x1;
		double dy = y2 - y1;
		bool steep = false;
		if(abs(dx) < abs(dy))
		{			
			swap(x1, y1);
			swap(x2, y2);
			swap(dx, dy);
			steep = true;
		}
		if(x2 < x1)
		{
			swap(x1, x2);
			swap(y1, y2);
		}
		if(x1 < 0.0)
		{
			if(x2 < 0.0)
				return;
			double l = -x1 / (x2 - x1);
			x1 = 0.0;
			y1 = y1 * (1.0 - l) + y2 * l;
		}
		if(x1 > (steep ? ptr->height : ptr->width))
			return;
		if(x2 > (steep ? ptr->height : ptr->width))
			x2 = steep ? ptr->height : ptr->width;
		double gradient = dy / dx;

		// handle first endpoint
		int xend = round(x1);
		double yend = y1 + gradient * (xend - x1);
		double xgap = rfpart(x1 + 0.5);
		int xpxl1 = xend;
		int ypxl1 = int(yend);
		if(steep)
		{
			CanvasDrawPointInternal(ypxl1, xpxl1, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(ypxl1 + 1, xpxl1, fpart(yend) * xgap, ptr);
		}else{
			CanvasDrawPointInternal(xpxl1, ypxl1, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(xpxl1, ypxl1 + 1, fpart(yend) * xgap, ptr);
		}
		double intery = yend + gradient; // first y-intersection for the main loop

		// handle second endpoint
		xend = round(x2);
		yend = y2 + gradient * (xend - x2);
		xgap = fpart(x2 + 0.5);
		int xpxl2 = xend ; // this will be used in the main loop
		int ypxl2 = int(yend);
		if(steep)
		{
			CanvasDrawPointInternal(ypxl2, xpxl2, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(ypxl2 + 1, xpxl2, fpart(yend) * xgap, ptr);
		}else{
			CanvasDrawPointInternal(xpxl2, ypxl2, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(xpxl2, ypxl2 + 1, fpart(yend) * xgap, ptr);
		}

		if(steep)
		{
			for(int x = xpxl1 + 1; x < xpxl2; x++)
			{
				CanvasDrawPointInternal(int(intery), x, rfpart(intery), ptr);
				CanvasDrawPointInternal(int(intery) + 1, x, fpart(intery), ptr);
				intery = intery + gradient;
			}
		}else{
			for(int x = xpxl1 + 1; x < xpxl2; x++)
			{
				CanvasDrawPointInternal(x, int(intery), rfpart(intery), ptr);
				CanvasDrawPointInternal(x, int(intery) + 1, fpart(intery), ptr);
				intery = intery + gradient;
			}
		}
	}